

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O0

int h264_sub_mb_pred(bitstream *str,h264_cabac_context *cabac,h264_slice *slice,h264_macroblock *mb)

{
  int iVar1;
  uint32_t local_90;
  int max;
  int sm;
  int ifrom [16];
  int pmode [4];
  int i;
  h264_macroblock *mb_local;
  h264_slice *slice_local;
  h264_cabac_context *cabac_local;
  bitstream *str_local;
  
  for (pmode[3] = 0; pmode[3] < 4; pmode[3] = pmode[3] + 1) {
    iVar1 = h264_sub_mb_type(str,cabac,slice->slice_type,mb->sub_mb_type + pmode[3]);
    if (iVar1 != 0) {
      return 1;
    }
    ifrom[(long)pmode[3] + 0xe] = sub_mb_part_info[mb->sub_mb_type[pmode[3]]][1];
    iVar1 = sub_mb_part_info[mb->sub_mb_type[pmode[3]]][0];
    (&max)[pmode[3] << 2] = -1;
    switch(iVar1) {
    case 0:
      (&max)[pmode[3] * 4 + 1] = pmode[3] << 2;
      (&max)[pmode[3] * 4 + 2] = pmode[3] << 2;
      (&max)[pmode[3] * 4 + 3] = pmode[3] << 2;
      break;
    case 1:
      (&max)[pmode[3] * 4 + 1] = pmode[3] << 2;
      (&max)[pmode[3] * 4 + 2] = -1;
      (&max)[pmode[3] * 4 + 3] = pmode[3] * 4 + 2;
      break;
    case 2:
      (&max)[pmode[3] * 4 + 1] = -1;
      (&max)[pmode[3] * 4 + 2] = pmode[3] << 2;
      (&max)[pmode[3] * 4 + 3] = pmode[3] * 4 + 1;
      break;
    case 3:
      (&max)[pmode[3] * 4 + 1] = -1;
      (&max)[pmode[3] * 4 + 2] = -1;
      (&max)[pmode[3] * 4 + 3] = -1;
    }
  }
  local_90 = slice->num_ref_idx_l0_active_minus1;
  if ((slice->mbaff_frame_flag != 0) && (mb->mb_field_decoding_flag != 0)) {
    local_90 = local_90 * 2 + 1;
  }
  for (pmode[3] = 0; pmode[3] < 4; pmode[3] = pmode[3] + 1) {
    if (((ifrom[(long)pmode[3] + 0xe] & 1U) == 0) || (mb->mb_type == 0x1f)) {
      iVar1 = vs_infer(str,mb->ref_idx[0] + pmode[3],0);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else {
      iVar1 = h264_ref_idx(str,cabac,pmode[3],0,local_90,mb->ref_idx[0] + pmode[3]);
      if (iVar1 != 0) {
        return 1;
      }
    }
  }
  local_90 = slice->num_ref_idx_l1_active_minus1;
  if ((slice->mbaff_frame_flag != 0) && (mb->mb_field_decoding_flag != 0)) {
    local_90 = local_90 * 2 + 1;
  }
  for (pmode[3] = 0; pmode[3] < 4; pmode[3] = pmode[3] + 1) {
    if ((ifrom[(long)pmode[3] + 0xe] & 2U) == 0) {
      iVar1 = vs_infer(str,mb->ref_idx[1] + pmode[3],0);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else {
      iVar1 = h264_ref_idx(str,cabac,pmode[3],1,local_90,mb->ref_idx[1] + pmode[3]);
      if (iVar1 != 0) {
        return 1;
      }
    }
  }
  for (pmode[3] = 0; pmode[3] < 0x10; pmode[3] = pmode[3] + 1) {
    if ((&max)[pmode[3]] == -1) {
      if ((ifrom[(long)(pmode[3] / 4) + 0xe] & 1U) == 0) {
        iVar1 = vs_infers(str,mb->mvd[0][pmode[3]],0);
        if (iVar1 != 0) {
          return 1;
        }
        iVar1 = vs_infers(str,mb->mvd[0][pmode[3]] + 1,0);
        if (iVar1 != 0) {
          return 1;
        }
      }
      else {
        iVar1 = h264_mvd(str,cabac,pmode[3],0,0,mb->mvd[0][pmode[3]]);
        if (iVar1 != 0) {
          return 1;
        }
        iVar1 = h264_mvd(str,cabac,pmode[3],1,0,mb->mvd[0][pmode[3]] + 1);
        if (iVar1 != 0) {
          return 1;
        }
      }
    }
    else {
      iVar1 = vs_infers(str,mb->mvd[0][pmode[3]],mb->mvd[0][(&max)[pmode[3]]][0]);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = vs_infers(str,mb->mvd[0][pmode[3]] + 1,mb->mvd[0][(&max)[pmode[3]]][1]);
      if (iVar1 != 0) {
        return 1;
      }
    }
  }
  pmode[3] = 0;
  do {
    if (0xf < pmode[3]) {
      iVar1 = vs_infer(str,&mb->intra_chroma_pred_mode,0);
      str_local._4_4_ = (uint)(iVar1 != 0);
      return str_local._4_4_;
    }
    if ((&max)[pmode[3]] == -1) {
      if ((ifrom[(long)(pmode[3] / 4) + 0xe] & 2U) == 0) {
        iVar1 = vs_infers(str,mb->mvd[1][pmode[3]],0);
        if (iVar1 != 0) {
          return 1;
        }
        iVar1 = vs_infers(str,(*(int32_t (*) [16] [2])(mb->block_luma_dc + -2))[pmode[3]] + 1,0);
        if (iVar1 != 0) {
          return 1;
        }
      }
      else {
        iVar1 = h264_mvd(str,cabac,pmode[3],0,1,mb->mvd[1][pmode[3]]);
        if (iVar1 != 0) {
          return 1;
        }
        iVar1 = h264_mvd(str,cabac,pmode[3],1,1,
                         (*(int32_t (*) [16] [2])(mb->block_luma_dc + -2))[pmode[3]] + 1);
        if (iVar1 != 0) {
          return 1;
        }
      }
    }
    else {
      iVar1 = vs_infers(str,mb->mvd[1][pmode[3]],mb->mvd[1][(&max)[pmode[3]]][0]);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = vs_infers(str,(*(int32_t (*) [16] [2])(mb->block_luma_dc + -2))[pmode[3]] + 1,
                        (*(int32_t (*) [16] [2])(mb->block_luma_dc + -2))[(&max)[pmode[3]]][1]);
      if (iVar1 != 0) {
        return 1;
      }
    }
    pmode[3] = pmode[3] + 1;
  } while( true );
}

Assistant:

int h264_sub_mb_pred(struct bitstream *str, struct h264_cabac_context *cabac, struct h264_slice *slice, struct h264_macroblock *mb) {
	int i;
	int pmode[4];
	int ifrom[16];
	for (i = 0; i < 4; i++) {
		if (h264_sub_mb_type(str, cabac, slice->slice_type, &mb->sub_mb_type[i])) return 1;
		pmode[i] = sub_mb_part_info[mb->sub_mb_type[i]][1];
		int sm = sub_mb_part_info[mb->sub_mb_type[i]][0];
		ifrom[i*4] = -1;
		switch (sm) {
			case 0:
				ifrom[i*4 + 1] = i*4;
				ifrom[i*4 + 2] = i*4;
				ifrom[i*4 + 3] = i*4;
				break;
			case 1:
				ifrom[i*4 + 1] = i*4;
				ifrom[i*4 + 2] = -1;
				ifrom[i*4 + 3] = i*4 + 2;
				break;
			case 2:
				ifrom[i*4 + 1] = -1;
				ifrom[i*4 + 2] = i*4;
				ifrom[i*4 + 3] = i*4 + 1;
				break;
			case 3:
				ifrom[i*4 + 1] = -1;
				ifrom[i*4 + 2] = -1;
				ifrom[i*4 + 3] = -1;
				break;
		}
	}
	int max = slice->num_ref_idx_l0_active_minus1;
	if (slice->mbaff_frame_flag && mb->mb_field_decoding_flag)
		max *= 2, max++;
	for (i = 0; i < 4; i++) {
		if (pmode[i] & 1 && mb->mb_type != H264_MB_TYPE_P_8X8REF0) {
			if (h264_ref_idx(str, cabac, i, 0, max, &mb->ref_idx[0][i])) return 1;
		} else {
			if (vs_infer(str, &mb->ref_idx[0][i], 0)) return 1;
		}
	}
	max = slice->num_ref_idx_l1_active_minus1;
	if (slice->mbaff_frame_flag && mb->mb_field_decoding_flag)
		max *= 2, max++;
	for (i = 0; i < 4; i++) {
		if (pmode[i] & 2) {
			if (h264_ref_idx(str, cabac, i, 1, max, &mb->ref_idx[1][i])) return 1;
		} else {
			if (vs_infer(str, &mb->ref_idx[1][i], 0)) return 1;
		}
	}
	for (i = 0; i < 16; i++) {
		if (ifrom[i] == -1) {
			if (pmode[i/4] & 1) {
				if (h264_mvd(str, cabac, i, 0, 0, &mb->mvd[0][i][0])) return 1;
				if (h264_mvd(str, cabac, i, 1, 0, &mb->mvd[0][i][1])) return 1;
			} else {
				if (vs_infers(str, &mb->mvd[0][i][0], 0)) return 1;
				if (vs_infers(str, &mb->mvd[0][i][1], 0)) return 1;
			}
		} else {
			if (vs_infers(str, &mb->mvd[0][i][0], mb->mvd[0][ifrom[i]][0])) return 1;
			if (vs_infers(str, &mb->mvd[0][i][1], mb->mvd[0][ifrom[i]][1])) return 1;
		}
	}
	for (i = 0; i < 16; i++) {
		if (ifrom[i] == -1) {
			if (pmode[i/4] & 2) {
				if (h264_mvd(str, cabac, i, 0, 1, &mb->mvd[1][i][0])) return 1;
				if (h264_mvd(str, cabac, i, 1, 1, &mb->mvd[1][i][1])) return 1;
			} else {
				if (vs_infers(str, &mb->mvd[1][i][0], 0)) return 1;
				if (vs_infers(str, &mb->mvd[1][i][1], 0)) return 1;
			}
		} else {
			if (vs_infers(str, &mb->mvd[1][i][0], mb->mvd[1][ifrom[i]][0])) return 1;
			if (vs_infers(str, &mb->mvd[1][i][1], mb->mvd[1][ifrom[i]][1])) return 1;
		}
	}
	if (vs_infer(str, &mb->intra_chroma_pred_mode, 0)) return 1;
	return 0;
}